

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

int stbi__decode_jpeg_header(stbi__jpeg *z,int scan)

{
  int a;
  int b;
  undefined8 *puVar1;
  stbi__uint32 b_00;
  stbi__context *s;
  stbi_uc sVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  stbi__uint32 sVar6;
  uint uVar7;
  uint uVar8;
  char *pcVar9;
  void *pvVar10;
  int extraout_EDX;
  int extraout_EDX_00;
  int why;
  long lVar11;
  ulong uVar12;
  long lVar13;
  int iVar14;
  int *piVar15;
  ulong uVar16;
  int iVar17;
  long in_FS_OFFSET;
  int local_6c;
  
  z->jfif = 0;
  z->app14_color_transform = -1;
  z->marker = 0xff;
  sVar2 = stbi__get_marker(z);
  if (sVar2 == 0xd8) {
    if (scan == 1) {
      return 1;
    }
    bVar3 = stbi__get_marker(z);
    while ((bVar3 != 0xc2 && ((bVar3 & 0xfe) != 0xc0))) {
      iVar4 = stbi__process_marker(z,(uint)bVar3);
      if (iVar4 == 0) {
        return 0;
      }
      while (bVar3 = stbi__get_marker(z), bVar3 == 0xff) {
        iVar4 = stbi__at_eof(z->s);
        if (iVar4 != 0) {
          pcVar9 = "no SOF";
          goto LAB_001170ae;
        }
      }
    }
    z->progressive = (uint)(bVar3 == 0xc2);
    s = z->s;
    uVar5 = stbi__get16be(s);
    if (10 < uVar5) {
      sVar2 = stbi__get8(s);
      if (sVar2 != '\b') {
        pcVar9 = "only 8-bit";
        goto LAB_001170ae;
      }
      sVar6 = stbi__get16be(s);
      s->img_y = sVar6;
      if (sVar6 == 0) {
        pcVar9 = "no header height";
        goto LAB_001170ae;
      }
      sVar6 = stbi__get16be(s);
      s->img_x = sVar6;
      if (sVar6 == 0) {
        pcVar9 = "0 width";
        goto LAB_001170ae;
      }
      if (0x1000000 < s->img_y) {
        pcVar9 = "too large";
        goto LAB_001170ae;
      }
      bVar3 = stbi__get8(s);
      if ((4 < bVar3) || ((0x1aU >> (bVar3 & 0x1f) & 1) == 0)) {
        pcVar9 = "bad component count";
        goto LAB_001170ae;
      }
      s->img_n = (uint)bVar3;
      for (lVar11 = 0; (ulong)bVar3 * 0x60 - lVar11 != 0; lVar11 = lVar11 + 0x60) {
        *(undefined8 *)((long)&z->img_comp[0].data + lVar11) = 0;
        *(undefined8 *)((long)&z->img_comp[0].linebuf + lVar11) = 0;
      }
      if (uVar5 == (uint)bVar3 + (uint)bVar3 * 2 + 8) {
        z->rgb = 0;
        piVar15 = &z->img_comp[0].tq;
        lVar11 = 0;
        while (uVar5 = s->img_n, lVar11 < (int)uVar5) {
          bVar3 = stbi__get8(s);
          ((anon_struct_96_18_0d0905d3 *)(piVar15 + -3))->id = (uint)bVar3;
          if ((s->img_n == 3) &&
             (bVar3 == *(byte *)((long)&stbi__process_frame_header(stbi__jpeg*,int)::rgb + lVar11)))
          {
            z->rgb = z->rgb + 1;
          }
          bVar3 = stbi__get8(s);
          piVar15[-2] = (uint)(bVar3 >> 4);
          if ((byte)(bVar3 + 0xb0) < 0xc0) goto LAB_00117315;
          piVar15[-1] = bVar3 & 0xf;
          if ((bVar3 & 0xf) - 5 < 0xfffffffc) goto LAB_00117309;
          bVar3 = stbi__get8(s);
          *piVar15 = (uint)bVar3;
          lVar11 = lVar11 + 1;
          piVar15 = piVar15 + 0x18;
          if (3 < bVar3) goto code_r0x00117260;
        }
        if (scan != 0) {
          return 1;
        }
        sVar6 = s->img_x;
        b_00 = s->img_y;
        uVar16 = 0;
        iVar4 = stbi__mad3sizes_valid(sVar6,b_00,uVar5,0);
        if (iVar4 == 0) {
          *(char **)(in_FS_OFFSET + -0x20) = "too large";
          return 0;
        }
        uVar12 = (ulong)uVar5;
        if ((int)uVar5 < 1) {
          uVar12 = uVar16;
        }
        lVar11 = uVar12 * 0x60;
        uVar5 = 1;
        uVar12 = 1;
        for (; iVar4 = (int)uVar12, lVar11 - uVar16 != 0; uVar16 = uVar16 + 0x60) {
          uVar7 = *(uint *)((long)&z->img_comp[0].h + uVar16);
          uVar8 = *(uint *)((long)&z->img_comp[0].v + uVar16);
          if ((int)uVar5 < (int)uVar7) {
            uVar5 = uVar7;
          }
          if (iVar4 < (int)uVar8) {
            uVar12 = (ulong)uVar8;
          }
        }
        lVar13 = -0x60;
        do {
          if (lVar11 - (lVar13 + 0x60) == 0) {
            z->img_h_max = uVar5;
            z->img_v_max = iVar4;
            z->img_mcu_w = uVar5 * 8;
            z->img_mcu_h = iVar4 * 8;
            lVar13 = 0;
            uVar7 = ((sVar6 + uVar5 * 8) - 1) / (uVar5 * 8);
            z->img_mcu_x = uVar7;
            uVar8 = ((b_00 + iVar4 * 8) - 1) / (uint)(iVar4 * 8);
            z->img_mcu_y = uVar8;
            local_6c = 1;
            while( true ) {
              if (lVar11 == lVar13) {
                return 1;
              }
              iVar17 = *(int *)((long)&z->img_comp[0].h + lVar13);
              iVar14 = *(int *)((long)&z->img_comp[0].v + lVar13);
              *(uint *)((long)&z->img_comp[0].x + lVar13) = (iVar17 * sVar6 + (uVar5 - 1)) / uVar5;
              *(int *)((long)&z->img_comp[0].y + lVar13) =
                   (int)((iVar14 * b_00 + iVar4 + -1) / uVar12);
              iVar17 = iVar17 * uVar7;
              a = iVar17 * 8;
              *(int *)((long)&z->img_comp[0].w2 + lVar13) = a;
              iVar14 = iVar14 * uVar8;
              b = iVar14 * 8;
              *(int *)((long)&z->img_comp[0].h2 + lVar13) = b;
              pvVar10 = stbi__malloc_mad2(a,b,0xf);
              *(undefined8 *)((long)&z->img_comp[0].coeff + lVar13) = 0;
              puVar1 = (undefined8 *)((long)&z->img_comp[0].raw_coeff + lVar13);
              *puVar1 = 0;
              puVar1[1] = 0;
              *(void **)((long)&z->img_comp[0].raw_data + lVar13) = pvVar10;
              why = extraout_EDX;
              if (pvVar10 == (void *)0x0) break;
              *(ulong *)((long)&z->img_comp[0].data + lVar13) =
                   (long)pvVar10 + 0xfU & 0xfffffffffffffff0;
              if (z->progressive != 0) {
                *(int *)((long)&z->img_comp[0].coeff_w + lVar13) = iVar17;
                *(int *)((long)&z->img_comp[0].coeff_h + lVar13) = iVar14;
                pvVar10 = stbi__malloc_mad3(a,b,2,0xf);
                *(void **)((long)&z->img_comp[0].raw_coeff + lVar13) = pvVar10;
                why = extraout_EDX_00;
                if (pvVar10 == (void *)0x0) break;
                *(ulong *)((long)&z->img_comp[0].coeff + lVar13) =
                     (long)pvVar10 + 0xfU & 0xfffffffffffffff0;
              }
              local_6c = local_6c + 1;
              lVar13 = lVar13 + 0x60;
            }
            *(char **)(in_FS_OFFSET + -0x20) = "outofmem";
            stbi__free_jpeg_components(z,local_6c,why);
            return 0;
          }
          if ((int)uVar5 % *(int *)((long)&z->img_comp[1].h + lVar13) != 0) goto LAB_00117315;
          piVar15 = (int *)((long)&z->img_comp[1].v + lVar13);
          lVar13 = lVar13 + 0x60;
          if (iVar4 % *piVar15 != 0) {
LAB_00117309:
            pcVar9 = "bad V";
            goto LAB_001170ae;
          }
        } while( true );
      }
    }
    pcVar9 = "bad SOF len";
  }
  else {
    pcVar9 = "no SOI";
  }
  goto LAB_001170ae;
code_r0x00117260:
  pcVar9 = "bad TQ";
  goto LAB_001170ae;
LAB_00117315:
  pcVar9 = "bad H";
LAB_001170ae:
  *(char **)(in_FS_OFFSET + -0x20) = pcVar9;
  return 0;
}

Assistant:

static int stbi__decode_jpeg_header(stbi__jpeg *z, int scan)
{
   int m;
   z->jfif = 0;
   z->app14_color_transform = -1; // valid values are 0,1,2
   z->marker = STBI__MARKER_none; // initialize cached marker to empty
   m = stbi__get_marker(z);
   if (!stbi__SOI(m)) return stbi__err("no SOI","Corrupt JPEG");
   if (scan == STBI__SCAN_type) return 1;
   m = stbi__get_marker(z);
   while (!stbi__SOF(m)) {
      if (!stbi__process_marker(z,m)) return 0;
      m = stbi__get_marker(z);
      while (m == STBI__MARKER_none) {
         // some files have extra padding after their blocks, so ok, we'll scan
         if (stbi__at_eof(z->s)) return stbi__err("no SOF", "Corrupt JPEG");
         m = stbi__get_marker(z);
      }
   }
   z->progressive = stbi__SOF_progressive(m);
   if (!stbi__process_frame_header(z, scan)) return 0;
   return 1;
}